

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomUniformBlockCase.cpp
# Opt level: O0

int __thiscall
deqp::gls::RandomUniformBlockCase::init(RandomUniformBlockCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int local_68;
  int local_60;
  int local_58;
  int local_48;
  int local_44;
  int ndx_2;
  int ndx_1;
  int ndx;
  int numFragBlocks;
  int numVtxBlocks;
  undefined1 local_20 [4];
  int numShared;
  Random rnd;
  RandomUniformBlockCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,this->m_seed);
  if (this->m_maxSharedBlocks < 1) {
    local_58 = 0;
  }
  else {
    local_58 = de::Random::getInt((Random *)local_20,1,this->m_maxSharedBlocks);
  }
  if (this->m_maxVertexBlocks - local_58 < 1) {
    local_60 = 0;
  }
  else {
    local_60 = de::Random::getInt((Random *)local_20,1,this->m_maxVertexBlocks - local_58);
  }
  if (this->m_maxFragmentBlocks - local_58 < 1) {
    local_68 = 0;
  }
  else {
    local_68 = de::Random::getInt((Random *)local_20,1,this->m_maxFragmentBlocks - local_58);
  }
  for (ndx_2 = 0; ndx_2 < local_58; ndx_2 = ndx_2 + 1) {
    generateBlock(this,(Random *)local_20,0x300);
  }
  for (local_44 = 0; local_44 < local_60; local_44 = local_44 + 1) {
    generateBlock(this,(Random *)local_20,0x100);
  }
  for (local_48 = 0; local_48 < local_68; local_48 = local_48 + 1) {
    generateBlock(this,(Random *)local_20,0x200);
  }
  de::Random::~Random((Random *)local_20);
  return extraout_EAX;
}

Assistant:

void RandomUniformBlockCase::init (void)
{
	de::Random rnd(m_seed);

	int numShared		= m_maxSharedBlocks				> 0	? rnd.getInt(1, m_maxSharedBlocks)				: 0;
	int numVtxBlocks	= m_maxVertexBlocks-numShared	> 0	? rnd.getInt(1, m_maxVertexBlocks-numShared)	: 0;
	int	numFragBlocks	= m_maxFragmentBlocks-numShared	> 0 ? rnd.getInt(1, m_maxFragmentBlocks-numShared)	: 0;

	for (int ndx = 0; ndx < numShared; ndx++)
		generateBlock(rnd, DECLARE_VERTEX|DECLARE_FRAGMENT);

	for (int ndx = 0; ndx < numVtxBlocks; ndx++)
		generateBlock(rnd, DECLARE_VERTEX);

	for (int ndx = 0; ndx < numFragBlocks; ndx++)
		generateBlock(rnd, DECLARE_FRAGMENT);
}